

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O0

int __thiscall ARAPlanner::force_planning_from_scratch_and_free_memory(ARAPlanner *this)

{
  int iVar1;
  size_type sVar2;
  reference ppiVar3;
  long *in_RDI;
  int j;
  uint i;
  int temp;
  int goal_id;
  int start_id;
  int local_1c;
  uint local_18;
  int local_10;
  int local_c;
  
  local_c = -1;
  local_10 = -1;
  if (*(long *)(in_RDI[0x10] + 0x30) != 0) {
    local_c = **(int **)(in_RDI[0x10] + 0x30);
  }
  iVar1 = local_c;
  if (*(long *)(in_RDI[0x10] + 0x28) != 0) {
    local_10 = **(int **)(in_RDI[0x10] + 0x28);
  }
  if ((*(byte *)(in_RDI + 0xf) & 1) == 0) {
    local_c = local_10;
    local_10 = iVar1;
  }
  (**(code **)(*in_RDI + 0x138))(in_RDI,in_RDI[0x10]);
  (**(code **)(*in_RDI + 0x130))(in_RDI,in_RDI[0x10]);
  (**(code **)(*in_RDI + 0x158))(in_RDI,in_RDI[0x10]);
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<int_*,_std::allocator<int_*>_>::size
                      ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8));
    if (sVar2 <= local_18) break;
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8),(ulong)local_18)
      ;
      (*ppiVar3)[local_1c] = -1;
    }
    local_18 = local_18 + 1;
  }
  if (-1 < local_c) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,local_c);
  }
  if (-1 < local_10) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,local_10);
  }
  return 1;
}

Assistant:

int ARAPlanner::force_planning_from_scratch_and_free_memory()
{
    SBPL_PRINTF("planner: forceplanfromscratch set\n");
    int start_id = -1;
    int goal_id = -1;
    if (pSearchStateSpace_->searchstartstate)
        start_id = pSearchStateSpace_->searchstartstate->StateID;
    if (pSearchStateSpace_->searchgoalstate)
        goal_id = pSearchStateSpace_->searchgoalstate->StateID;

    if (!bforwardsearch) {
        int temp = start_id;
        start_id = goal_id;
        goal_id = temp;
    }

    DeleteSearchStateSpace(pSearchStateSpace_);
    CreateSearchStateSpace(pSearchStateSpace_);
    InitializeSearchStateSpace(pSearchStateSpace_);
    for (unsigned int i = 0; i < environment_->StateID2IndexMapping.size(); i++)
        for (int j = 0; j < NUMOFINDICES_STATEID2IND; j++)
            environment_->StateID2IndexMapping[i][j] = -1;

    if (start_id >= 0)
        set_start(start_id);
    if (goal_id >= 0)
        set_goal(goal_id);
    return 1;
}